

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O1

Vec_Int_t * Nm_ManReturnNameIds(Nm_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = p->nEntries;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar6 = iVar7;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar4->pArray = piVar5;
  if (0 < p->nBins) {
    lVar8 = 0;
    do {
      if (p->pBinsI2N[lVar8] != (Nm_Entry_t *)0x0) {
        uVar1 = p->pBinsI2N[lVar8]->ObjId;
        uVar2 = pVVar4->nSize;
        uVar3 = pVVar4->nCap;
        if (uVar2 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(0x40);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,0x40);
            }
            pVVar4->pArray = piVar5;
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar3 * 2;
            if (iVar7 <= (int)uVar3) goto LAB_0049a202;
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar3 << 3);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar3 << 3);
            }
            pVVar4->pArray = piVar5;
          }
          if (piVar5 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar4->nCap = iVar7;
        }
LAB_0049a202:
        pVVar4->nSize = uVar2 + 1;
        pVVar4->pArray[(int)uVar2] = uVar1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nBins);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Nm_ManReturnNameIds( Nm_Man_t * p )
{
    Vec_Int_t * vNameIds;
    int i;
    vNameIds = Vec_IntAlloc( p->nEntries );
    for ( i = 0; i < p->nBins; i++ )
        if ( p->pBinsI2N[i] )
            Vec_IntPush( vNameIds, p->pBinsI2N[i]->ObjId );
    return vNameIds;
}